

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int tinyexr::hufEncode(longlong *hcode,unsigned_short *in,int ni,int rlc,char *out)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  unsigned_short uVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  int local_38;
  
  uVar10 = *in;
  pcVar12 = out;
  if (ni < 2) {
    uVar6 = 0;
    uVar8 = 0;
    iVar14 = 0;
  }
  else {
    iVar14 = 0;
    uVar13 = 1;
    uVar8 = 0;
    uVar6 = 0;
    do {
      if (iVar14 < 0xff && uVar10 == in[uVar13]) {
        iVar3 = iVar14 + 1;
      }
      else {
        lVar1 = hcode[rlc];
        uVar15 = (uint)hcode[uVar10];
        uVar5 = uVar15 & 0x3f;
        uVar4 = (uint)lVar1;
        uVar9 = uVar4 & 0x3f;
        uVar7 = (ulong)iVar14;
        uVar11 = hcode[uVar10] >> 6;
        if ((long)((ulong)uVar5 + (ulong)uVar9 + 8) < (long)(uVar5 * uVar7)) {
          uVar11 = uVar6 << (sbyte)uVar5 | uVar11;
          uVar5 = (uVar15 & 0x3f) + (int)uVar8;
          uVar8 = (ulong)uVar5;
          if (7 < (int)uVar5) {
            uVar8 = (ulong)uVar5;
            do {
              uVar8 = uVar8 - 8;
              *pcVar12 = (char)((long)uVar11 >> ((byte)uVar8 & 0x3f));
              pcVar12 = pcVar12 + 1;
            } while (7 < uVar8);
          }
          uVar4 = uVar4 & 0x3f;
          uVar6 = uVar11 << (sbyte)uVar9 | lVar1 >> 6;
          uVar5 = (int)uVar8 + uVar4;
          if ((int)uVar5 < 8) {
            uVar4 = uVar5 + 8;
            uVar8 = (ulong)uVar4;
            uVar6 = uVar6 << 8 | uVar7;
            if (-1 < (int)uVar5) goto LAB_00125423;
          }
          else {
            uVar11 = (ulong)uVar5;
            uVar4 = uVar4 + (int)uVar8 + 8;
            do {
              uVar11 = uVar11 - 8;
              *pcVar12 = (char)((long)uVar6 >> ((byte)uVar11 & 0x3f));
              pcVar12 = pcVar12 + 1;
              uVar4 = uVar4 - 8;
            } while (7 < uVar11);
            uVar6 = uVar6 << 8 | uVar7;
LAB_00125423:
            uVar8 = (ulong)uVar4;
            do {
              uVar8 = uVar8 - 8;
              *pcVar12 = (char)((long)uVar6 >> ((byte)uVar8 & 0x3f));
              pcVar12 = pcVar12 + 1;
            } while (7 < uVar8);
          }
          iVar3 = 0;
        }
        else {
          iVar3 = 0;
          if (-1 < iVar14) {
            do {
              uVar4 = (int)uVar8 + (uVar15 & 0x3f);
              uVar8 = (ulong)uVar4;
              uVar6 = uVar6 << (sbyte)uVar5 | uVar11;
              if (7 < (int)uVar4) {
                uVar8 = (ulong)uVar4;
                do {
                  uVar8 = uVar8 - 8;
                  *pcVar12 = (char)((long)uVar6 >> ((byte)uVar8 & 0x3f));
                  pcVar12 = pcVar12 + 1;
                } while (7 < uVar8);
              }
              bVar2 = 0 < iVar14;
              iVar14 = iVar14 + -1;
            } while (bVar2);
          }
        }
      }
      iVar14 = iVar3;
      uVar10 = in[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)ni);
  }
  lVar1 = hcode[rlc];
  uVar15 = (uint)hcode[uVar10];
  uVar5 = uVar15 & 0x3f;
  uVar4 = (uint)lVar1;
  uVar9 = uVar4 & 0x3f;
  uVar11 = (ulong)iVar14;
  uVar13 = hcode[uVar10] >> 6;
  if ((long)((ulong)uVar5 + (ulong)uVar9 + 8) < (long)(uVar5 * uVar11)) {
    uVar13 = uVar6 << (sbyte)uVar5 | uVar13;
    uVar5 = (uVar15 & 0x3f) + (int)uVar8;
    uVar8 = (ulong)uVar5;
    if (7 < (int)uVar5) {
      uVar8 = (ulong)uVar5;
      do {
        uVar8 = uVar8 - 8;
        *pcVar12 = (char)((long)uVar13 >> ((byte)uVar8 & 0x3f));
        pcVar12 = pcVar12 + 1;
      } while (7 < uVar8);
    }
    uVar4 = uVar4 & 0x3f;
    uVar6 = uVar13 << (sbyte)uVar9 | lVar1 >> 6;
    uVar5 = (int)uVar8 + uVar4;
    if ((int)uVar5 < 8) {
      uVar4 = uVar5 + 8;
      uVar8 = (ulong)uVar4;
      uVar6 = uVar6 << 8 | uVar11;
      if ((int)uVar5 < 0) goto LAB_00125578;
    }
    else {
      uVar13 = (ulong)uVar5;
      uVar4 = uVar4 + (int)uVar8 + 8;
      do {
        uVar13 = uVar13 - 8;
        *pcVar12 = (char)((long)uVar6 >> ((byte)uVar13 & 0x3f));
        pcVar12 = pcVar12 + 1;
        uVar4 = uVar4 - 8;
      } while (7 < uVar13);
      uVar6 = uVar6 << 8 | uVar11;
    }
    uVar8 = (ulong)uVar4;
    do {
      uVar8 = uVar8 - 8;
      *pcVar12 = (char)((long)uVar6 >> ((byte)uVar8 & 0x3f));
      pcVar12 = pcVar12 + 1;
    } while (7 < uVar8);
  }
  else if (-1 < iVar14) {
    do {
      uVar4 = (int)uVar8 + (uVar15 & 0x3f);
      uVar8 = (ulong)uVar4;
      uVar6 = uVar6 << (sbyte)uVar5 | uVar13;
      if (7 < (int)uVar4) {
        uVar8 = (ulong)uVar4;
        do {
          uVar8 = uVar8 - 8;
          *pcVar12 = (char)((long)uVar6 >> ((byte)uVar8 & 0x3f));
          pcVar12 = pcVar12 + 1;
        } while (7 < uVar8);
      }
      bVar2 = 0 < iVar14;
      iVar14 = iVar14 + -1;
    } while (bVar2);
  }
LAB_00125578:
  if ((int)uVar8 != 0) {
    *pcVar12 = (char)(uVar6 << (8U - (char)uVar8 & 0x3f));
  }
  local_38 = (int)out;
  return (int)uVar8 + ((int)pcVar12 - local_38) * 8;
}

Assistant:

int hufEncode                   // return: output size (in bits)
    (const long long *hcode,    // i : encoding table
     const unsigned short *in,  // i : uncompressed input buffer
     const int ni,              // i : input buffer size (in bytes)
     int rlc,                   // i : rl code
     char *out)                 //  o: compressed output buffer
{
  char *outStart = out;
  long long c = 0;  // bits not yet written to out
  int lc = 0;       // number of valid bits in c (LSB)
  int s = in[0];
  int cs = 0;

  //
  // Loop on input values
  //

  for (int i = 1; i < ni; i++) {
    //
    // Count same values or send code
    //

    if (s == in[i] && cs < 255) {
      cs++;
    } else {
      sendCode(hcode[s], cs, hcode[rlc], c, lc, out);
      cs = 0;
    }

    s = in[i];
  }

  //
  // Send remaining code
  //

  sendCode(hcode[s], cs, hcode[rlc], c, lc, out);

  if (lc) *out = (c << (8 - lc)) & 0xff;

  return (out - outStart) * 8 + lc;
}